

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O0

int ifInputVectorsAreConsistent(saucy *s,int *leftVec,int *rightVec)

{
  int iVar1;
  int iVar2;
  int n;
  int numouts;
  int right_bit;
  int left_bit;
  int lab;
  int j;
  int i;
  int *rightVec_local;
  int *leftVec_local;
  saucy *s_local;
  
  iVar1 = Abc_NtkPoNum(s->pNtk);
  iVar2 = Abc_NtkPiNum(s->pNtk);
  lab = iVar1;
  while( true ) {
    if (iVar1 + iVar2 <= lab) {
      return 1;
    }
    left_bit = lab;
    while (left_bit = left_bit + 1, left_bit <= lab + (s->right).clen[lab]) {
      if (leftVec[(s->left).lab[lab] - iVar1] != leftVec[(s->left).lab[left_bit] - iVar1]) {
        return -1;
      }
    }
    left_bit = lab;
    while (left_bit = left_bit + 1, left_bit <= lab + (s->right).clen[lab]) {
      if (rightVec[(s->right).lab[lab] - iVar1] != rightVec[(s->right).lab[left_bit] - iVar1]) {
        return 0;
      }
    }
    if (leftVec[(s->left).lab[lab] - iVar1] != rightVec[(s->right).lab[lab] - iVar1]) break;
    lab = (s->right).clen[lab] + 1 + lab;
  }
  return 0;
}

Assistant:

static int
ifInputVectorsAreConsistent( struct saucy * s, int * leftVec, int * rightVec )
{
    /* This function assumes that left and right partitions are isomorphic */
    int i, j;
    int lab;
    int left_bit, right_bit;
    int numouts =  Abc_NtkPoNum(s->pNtk);
    int n = numouts + Abc_NtkPiNum(s->pNtk);

    for (i = numouts; i < n; i += (s->right.clen[i]+1)) {       
        lab = s->left.lab[i] - numouts;
        left_bit = leftVec[lab];
        for (j = i+1; j <= (i + s->right.clen[i]); j++) {
            lab = s->left.lab[j] - numouts;         
            if (left_bit != leftVec[lab]) return -1;
        }       
        
        lab = s->right.lab[i] - numouts;
        right_bit = rightVec[lab];
        for (j = i+1; j <= (i + s->right.clen[i]); j++) {
            lab = s->right.lab[j] - numouts;            
            if (right_bit != rightVec[lab]) return 0;           
        }

        if (left_bit != right_bit) 
             return 0;
    }

    return 1;
}